

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp.h
# Opt level: O0

void dts_reset(DataTransferStatsDirection *s,unsigned_long starting_size)

{
  unsigned_long starting_size_local;
  DataTransferStatsDirection *s_local;
  
  s->expired = false;
  s->remaining = starting_size;
  s->running = starting_size != 0;
  return;
}

Assistant:

static inline void dts_reset(struct DataTransferStatsDirection *s,
                             unsigned long starting_size)
{
    s->expired = false;
    s->remaining = starting_size;
    /*
     * The semantics of setting CONF_ssh_rekey_data to zero are to
     * disable data-volume based rekeying completely. So if the
     * starting size is actually zero, we don't set 'running' to true
     * in the first place, which means we won't ever set the expired
     * flag.
     */
    s->running = (starting_size != 0);
}